

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

bool __thiscall
matchit::impl::Id<mathiu::impl::Difference>::matchValue<mathiu::impl::Difference_const&>
          (Id<mathiu::impl::Difference> *this,Difference *v)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>_&>
  _Var1;
  bool bVar2;
  bool bVar3;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,_matchit::impl::IdBlock<mathiu::impl::Difference>_*>_&>
  pIVar4;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>_&>
  lhs;
  long lVar5;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_25;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1179:45)>
  local_24;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_23;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
  local_22;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_21;
  
  pIVar4 = std::
           visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>&)_1_,matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,matchit::impl::IdBlock<mathiu::impl::Difference>*>&>
                     (&local_25,&this->mBlock);
  _Var1 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Difference>::hasValue()const::_lambda(mathiu::impl::Difference_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::hasValue()const::_lambda(mathiu::impl::Difference_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>const&>
                    (&local_24,&(pIVar4->super_IdBlockBase<mathiu::impl::Difference>).mVariant);
  if (_Var1) {
    pIVar4 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>&)_1_,matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,matchit::impl::IdBlock<mathiu::impl::Difference>*>&>
                       (&local_23,&this->mBlock);
    lhs = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(mathiu::impl::Difference_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(mathiu::impl::Difference_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(mathiu::impl::Difference*)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>const&>
                    (&local_22,&(pIVar4->super_IdBlockBase<mathiu::impl::Difference>).mVariant);
    bVar2 = mathiu::impl::equal((ExprPtr *)lhs,(ExprPtr *)v);
    if (bVar2) {
      lVar5 = 0;
      do {
        bVar2 = lVar5 == 0x10;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = mathiu::impl::equal((ExprPtr *)
                                    ((long)&(lhs->super_ExprPtrArray<2>)._M_elems[1].
                                            super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar5),
                                    (ExprPtr *)
                                    ((long)&(v->super_ExprPtrArray<2>)._M_elems[1].
                                            super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (bVar3);
    }
    else {
      bVar2 = false;
    }
  }
  else {
    pIVar4 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>&)_1_,matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,matchit::impl::IdBlock<mathiu::impl::Difference>*>&>
                       (&local_21,&this->mBlock);
    IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>
              (&(pIVar4->super_IdBlockBase<mathiu::impl::Difference>).mVariant,v);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }